

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O0

void __thiscall
cmQtAutoGenerator::Logger::ErrorCommand
          (Logger *this,GenT genType,string_view message,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *command,string *output)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> *args;
  char *pcVar2;
  string_view title;
  string_view title_00;
  string_view title_01;
  string_view sVar3;
  lock_guard<std::mutex> local_348;
  lock_guard<std::mutex> lock;
  char *local_330;
  cmAlphaNum local_328;
  basic_string_view<char,_std::char_traits<char>_> local_2f8;
  string local_2e8;
  cmAlphaNum local_2c8;
  string local_298;
  string local_278;
  cmAlphaNum local_258;
  basic_string_view<char,_std::char_traits<char>_> local_228;
  string local_218;
  cmAlphaNum local_1f8;
  string local_1c8;
  Logger *local_1a8;
  size_t sStack_1a0;
  char *local_190 [3];
  cmAlphaNum local_178;
  string_view local_148;
  cmAlphaNum local_138;
  string local_108;
  undefined1 local_e8 [16];
  string local_d8;
  cmAlphaNum local_b8;
  cmAlphaNum local_88;
  undefined1 local_58 [8];
  string msg;
  string *output_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *command_local;
  GenT genType_local;
  Logger *this_local;
  string_view message_local;
  
  pcVar2 = message._M_str;
  this_local = (Logger *)message._M_len;
  msg.field_2._8_8_ = output;
  message_local._M_len = (size_t)pcVar2;
  cmAlphaNum::cmAlphaNum(&local_88,'\n');
  local_148 = cmQtAutoGen::GeneratorName(genType);
  cmAlphaNum::cmAlphaNum(&local_138,local_148);
  cmAlphaNum::cmAlphaNum(&local_178," subprocess error");
  cmStrCat<>(&local_108,&local_138,&local_178);
  local_e8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_108);
  title._M_len = local_e8._8_8_;
  title._M_str = pcVar2;
  HeadLine_abi_cxx11_(&local_d8,local_e8._0_8_,title);
  cmAlphaNum::cmAlphaNum(&local_b8,&local_d8);
  local_1a8 = this_local;
  sStack_1a0 = message_local._M_len;
  sVar3._M_str = (char *)message_local._M_len;
  sVar3._M_len = (size_t)this_local;
  bVar1 = cmHasSuffix(sVar3,'\n');
  local_190[0] = "\n\n";
  if (bVar1) {
    local_190[0] = "\n";
  }
  args = (basic_string_view<char,_std::char_traits<char>_> *)&this_local;
  cmStrCat<std::basic_string_view<char,std::char_traits<char>>,char_const*>
            ((string *)local_58,&local_88,&local_b8,args,local_190);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_108);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_228,"Command");
  title_00._M_str = (char *)args;
  title_00._M_len = (size_t)local_228._M_str;
  HeadLine_abi_cxx11_(&local_218,(Logger *)local_228._M_len,title_00);
  cmAlphaNum::cmAlphaNum(&local_1f8,&local_218);
  cmQtAutoGen::QuotedCommand(&local_278,command);
  cmAlphaNum::cmAlphaNum(&local_258,&local_278);
  pcVar2 = "\n\n";
  cmStrCat<char[3]>(&local_1c8,&local_1f8,&local_258,(char (*) [3])0xc47773);
  std::__cxx11::string::operator+=((string *)local_58,(string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_218);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2f8,"Output");
  title_01._M_str = pcVar2;
  title_01._M_len = (size_t)local_2f8._M_str;
  HeadLine_abi_cxx11_(&local_2e8,(Logger *)local_2f8._M_len,title_01);
  cmAlphaNum::cmAlphaNum(&local_2c8,&local_2e8);
  cmAlphaNum::cmAlphaNum(&local_328,(string *)msg.field_2._8_8_);
  sVar3 = (string_view)
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)msg.field_2._8_8_);
  lock._M_device = (mutex_type *)sVar3._M_len;
  bVar1 = cmHasSuffix(sVar3,'\n');
  local_330 = "\n\n";
  if (bVar1) {
    local_330 = "\n";
  }
  cmStrCat<char_const*>(&local_298,&local_2c8,&local_328,&local_330);
  std::__cxx11::string::operator+=((string *)local_58,(string *)&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::lock_guard<std::mutex>::lock_guard(&local_348,&this->Mutex_);
  cmSystemTools::Stderr((string *)local_58);
  std::lock_guard<std::mutex>::~lock_guard(&local_348);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void cmQtAutoGenerator::Logger::ErrorCommand(
  GenT genType, cm::string_view message,
  std::vector<std::string> const& command, std::string const& output) const
{
  std::string msg = cmStrCat(
    '\n', HeadLine(cmStrCat(GeneratorName(genType), " subprocess error")),
    message, cmHasSuffix(message, '\n') ? "\n" : "\n\n");
  msg += cmStrCat(HeadLine("Command"), QuotedCommand(command), "\n\n");
  msg += cmStrCat(HeadLine("Output"), output,
                  cmHasSuffix(output, '\n') ? "\n" : "\n\n");
  {
    std::lock_guard<std::mutex> lock(this->Mutex_);
    cmSystemTools::Stderr(msg);
  }
}